

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::IsDefaultArrayValuesFunction
               (RecyclableObject *function,ScriptContext *scriptContext)

{
  bool bVar1;
  ScriptFunction *this;
  FunctionProxy *pFVar2;
  JavascriptMethod p_Var3;
  JavascriptMethod p_Var4;
  
  bVar1 = ScriptContext::IsJsBuiltInEnabled(scriptContext);
  if (((bVar1) && (bVar1 = VarIsImpl<Js::ScriptFunction>(function), bVar1)) &&
     (this = UnsafeVarTo<Js::ScriptFunction,Js::RecyclableObject>(function),
     this != (ScriptFunction *)0x0)) {
    EnsureBuiltInEngineIsReady(Array_prototype,scriptContext);
    pFVar2 = ScriptFunction::GetFunctionProxy(this);
    return (bool)((pFVar2->field_0x44 & 8) >> 3);
  }
  p_Var3 = RecyclableObject::GetEntryPoint(function);
  p_Var4 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptArray::EntryInfo::Values);
  return p_Var3 == p_Var4;
}

Assistant:

bool JavascriptLibrary::IsDefaultArrayValuesFunction(RecyclableObject * function, ScriptContext *scriptContext)
    {
#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            ScriptFunction * scriptFunction = JavascriptOperators::TryFromVar<ScriptFunction>(function);
            if (scriptFunction)
            {
                EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
                return scriptFunction->GetFunctionProxy()->IsJsBuiltInCode();
            }
        }
#endif
        JavascriptMethod method = function->GetEntryPoint();
        return method == JavascriptArray::EntryInfo::Values.GetOriginalEntryPoint();
    }